

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_precrq_rs_ph_w_mips
          (target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict *env)

{
  uint16_t uVar1;
  uint16_t uVar2;
  undefined4 local_1c;
  uint16_t tempA;
  uint16_t tempB;
  CPUMIPSState_conflict *env_local;
  target_ulong_conflict rt_local;
  target_ulong_conflict rs_local;
  
  uVar1 = mipsdsp_trunc16_sat16_round(rs,env);
  uVar2 = mipsdsp_trunc16_sat16_round(rt,env);
  local_1c = CONCAT22(uVar1,uVar2);
  return local_1c;
}

Assistant:

target_ulong helper_precrq_rs_ph_w(target_ulong rs, target_ulong rt,
                                   CPUMIPSState *env)
{
    uint16_t tempB, tempA;

    tempB = mipsdsp_trunc16_sat16_round(rs, env);
    tempA = mipsdsp_trunc16_sat16_round(rt, env);

    return MIPSDSP_RETURN32_16(tempB, tempA);
}